

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

DescriptorScriptPubKeyMan * __thiscall
wallet::CWallet::GetDescriptorScriptPubKeyMan(CWallet *this,WalletDescriptor *desc)

{
  long lVar1;
  bool bVar2;
  DescriptorScriptPubKeyMan *this_00;
  WalletDescriptor *desc_00;
  pointer pSVar3;
  long in_RDI;
  long in_FS_OFFSET;
  DescriptorScriptPubKeyMan *spk_manager;
  pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>
  *spk_man_pair;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  _Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
  *in_stack_ffffffffffffff98;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  DescriptorScriptPubKeyMan *in_stack_ffffffffffffffa8;
  DescriptorScriptPubKeyMan *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (DescriptorScriptPubKeyMan *)(in_RDI + 0x170);
  std::
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  ::begin(in_stack_ffffffffffffffa0);
  std::
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  ::end(in_stack_ffffffffffffffa0);
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffffa8,
                                 (_Self *)in_stack_ffffffffffffffa0), ((bVar2 ^ 0xffU) & 1) != 0) {
    desc_00 = (WalletDescriptor *)
              std::
              _Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
              ::operator*(in_stack_ffffffffffffff98);
    pSVar3 = std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             ::get((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                    *)in_stack_ffffffffffffff98);
    if (pSVar3 == (pointer)0x0) {
      local_20 = (DescriptorScriptPubKeyMan *)0x0;
    }
    else {
      local_20 = (DescriptorScriptPubKeyMan *)
                 __dynamic_cast(pSVar3,&ScriptPubKeyMan::typeinfo,
                                &DescriptorScriptPubKeyMan::typeinfo,0);
    }
    in_stack_ffffffffffffffa8 = local_20;
    if ((local_20 != (DescriptorScriptPubKeyMan *)0x0) &&
       (bVar2 = DescriptorScriptPubKeyMan::HasWalletDescriptor(this_00,desc_00), bVar2))
    goto LAB_00aee089;
    std::
    _Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
    ::operator++(in_stack_ffffffffffffff98);
  }
  local_20 = (DescriptorScriptPubKeyMan *)0x0;
LAB_00aee089:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

DescriptorScriptPubKeyMan* CWallet::GetDescriptorScriptPubKeyMan(const WalletDescriptor& desc) const
{
    for (auto& spk_man_pair : m_spk_managers) {
        // Try to downcast to DescriptorScriptPubKeyMan then check if the descriptors match
        DescriptorScriptPubKeyMan* spk_manager = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man_pair.second.get());
        if (spk_manager != nullptr && spk_manager->HasWalletDescriptor(desc)) {
            return spk_manager;
        }
    }

    return nullptr;
}